

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall
cert::Camera::Camera(Camera *this,Vec3 lookfrom,Vec3 lookat,Vec3 vup,float vfov,float aspect)

{
  double dVar1;
  float fVar2;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  Vec3 VVar3;
  Vec3 VVar4;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  Vec3 local_88;
  Vec3 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Vec3 local_48;
  Vec3 local_38;
  
  local_38.z = vup.z;
  local_38._0_8_ = vup._0_8_;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = lookfrom._0_8_;
  local_68._12_4_ = in_XMM0_Dd;
  *(undefined8 *)&(this->horizontal).z = 0;
  (this->vertical).y = 0.0;
  (this->vertical).z = 0.0;
  (this->upper_left_corner).y = 0.0;
  (this->upper_left_corner).z = 0.0;
  (this->horizontal).x = 0.0;
  (this->horizontal).y = 0.0;
  (this->origin).x = 0.0;
  (this->origin).y = 0.0;
  *(undefined8 *)&(this->origin).z = 0;
  dVar1 = ((double)vfov * 3.141) / 180.0;
  dVar1 = tan((double)CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1 * 0.5));
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = dVar1;
  local_58._12_4_ = extraout_XMM0_Dd;
  fVar2 = aspect * SUB84(dVar1,0);
  (this->origin).x = (float)local_68._0_4_;
  (this->origin).y = (float)local_68._4_4_;
  (this->origin).z = lookfrom.z;
  local_a8 = lookat.x;
  fStack_a4 = lookat.y;
  local_78.z = lookfrom.z - lookat.z;
  local_78.y = (float)local_68._4_4_ - fStack_a4;
  local_78.x = (float)local_68._0_4_ - local_a8;
  VVar3 = normalize(&local_78);
  local_48.z = VVar3.z;
  local_48._0_8_ = VVar3._0_8_;
  VVar3 = cross(&local_38,&local_48);
  local_88.z = VVar3.z;
  local_88._0_8_ = VVar3._0_8_;
  VVar3 = normalize(&local_88);
  local_78.z = VVar3.z;
  local_78._0_8_ = VVar3._0_8_;
  VVar3 = cross(&local_48,&local_78);
  local_88.z = local_78.z * fVar2;
  local_88.y = fVar2 * local_78.y;
  local_88.x = fVar2 * local_78.x;
  VVar4 = operator-(&this->origin,&local_88);
  local_98 = VVar3.x;
  fStack_94 = VVar3.y;
  (this->upper_left_corner).x = ((float)local_58._0_4_ * local_98 + VVar4.x) - local_48.x;
  (this->upper_left_corner).y = ((float)local_58._0_4_ * fStack_94 + VVar4.y) - local_48.y;
  (this->upper_left_corner).z = ((float)local_58._0_4_ * VVar3.z + VVar4.z) - local_48.z;
  fVar2 = fVar2 + fVar2;
  (this->horizontal).x = fVar2 * local_78.x;
  (this->horizontal).y = fVar2 * local_78.y;
  (this->horizontal).z = fVar2 * local_78.z;
  fVar2 = (float)local_58._0_4_ + (float)local_58._0_4_;
  (this->vertical).x = fVar2 * local_98;
  (this->vertical).y = fVar2 * fStack_94;
  (this->vertical).z = fVar2 * VVar3.z;
  return;
}

Assistant:

constexpr Camera (Vec3 lookfrom, Vec3 lookat, Vec3 vup, float vfov, float aspect)
	{
		Vec3 u, v, w;
		float theta = vfov * 3.141 / 180;
		float half_height = tan (theta / 2);
		float half_width = aspect * half_height;
		origin = lookfrom;
		w = normalize (lookfrom - lookat);
		u = normalize (cross (vup, w));
		v = cross (w, u);
		upper_left_corner = origin - half_width * u + half_height * v - w;
		horizontal = 2 * half_width * u;
		vertical = 2 * half_height * v;
	}